

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

text * __thiscall lest::env::sections_abi_cxx11_(text *__return_storage_ptr__,env *this)

{
  pointer pbVar1;
  long lVar2;
  long lVar3;
  text msg;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  text *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->opt).verbose == false) {
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_78,local_78 + local_70);
    if (local_78 == local_68) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_78 = local_68;
    local_70 = 0;
    local_68[0] = 0;
    pbVar1 = (this->ctx).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_58 = __return_storage_ptr__;
    if ((this->ctx).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pbVar1) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        std::operator+(&local_50,"\n  ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&(pbVar1->_M_dataplus)._M_p + lVar2));
        std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        lVar3 = lVar3 + 1;
        pbVar1 = (this->ctx).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar2 = lVar2 + 0x20;
      } while (lVar3 != (long)(this->ctx).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
    }
    __return_storage_ptr__ = local_58;
    (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
    std::__cxx11::string::_M_construct<char*>((string *)local_58,local_78,local_78 + local_70);
    if (local_78 == local_68) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_78);
  return __return_storage_ptr__;
}

Assistant:

text sections()
    {
        if ( ! opt.verbose )
            return "";

        text msg;
        for( size_t i = 0; i != ctx.size(); ++i )
        {
            msg += "\n  " + ctx[i];
        }
        return msg;
    }